

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr xmlCreateMemoryParserCtxt(char *buffer,int size)

{
  int iVar1;
  xmlParserInputPtr value;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int size_local;
  char *buffer_local;
  
  if (size < 0) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)xmlNewParserCtxt();
    if ((xmlParserCtxtPtr)buffer_local == (xmlParserCtxtPtr)0x0) {
      buffer_local = (char *)0x0;
    }
    else {
      value = xmlCtxtNewInputFromMemory
                        ((xmlParserCtxtPtr)buffer_local,(char *)0x0,buffer,(long)size,(char *)0x0,0)
      ;
      if (value == (xmlParserInputPtr)0x0) {
        xmlFreeParserCtxt((xmlParserCtxtPtr)buffer_local);
        buffer_local = (char *)0x0;
      }
      else {
        iVar1 = xmlCtxtPushInput((xmlParserCtxtPtr)buffer_local,value);
        if (iVar1 < 0) {
          xmlFreeInputStream(value);
          xmlFreeParserCtxt((xmlParserCtxtPtr)buffer_local);
          buffer_local = (char *)0x0;
        }
      }
    }
  }
  return (xmlParserCtxtPtr)buffer_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateMemoryParserCtxt(const char *buffer, int size) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    if (size < 0)
	return(NULL);

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    input = xmlCtxtNewInputFromMemory(ctxt, NULL, buffer, size, NULL, 0);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}